

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O1

Try<void> * __thiscall async_simple::Try<void>::operator=(Try<void> *this,Try<void> *other)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *__tmp_2;
  void *__tmp_1;
  exception_ptr __tmp;
  
  if (this != other) {
    pvVar1 = (this->_error)._M_exception_object;
    (this->_error)._M_exception_object = (void *)0x0;
    pvVar2 = (other->_error)._M_exception_object;
    (other->_error)._M_exception_object = (void *)0x0;
    pvVar3 = (this->_error)._M_exception_object;
    (this->_error)._M_exception_object = pvVar2;
    if (pvVar3 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    pvVar2 = (other->_error)._M_exception_object;
    (other->_error)._M_exception_object = pvVar1;
    if (pvVar2 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  return this;
}

Assistant:

Try& operator=(Try&& other) {
        if (this != &other) {
            std::swap(_error, other._error);
        }
        return *this;
    }